

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O2

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseShortMessageStatus(MidiStreamParserImpl *this,Bit8u *stream)

{
  bool bVar1;
  Bit8u status;
  Bit8u local_11;
  
  local_11 = *stream;
  bVar1 = processStatusByte(this,&local_11);
  if ((char)local_11 < '\0') {
    *this->streamBuffer = local_11;
    this->streamBufferSize = this->streamBufferSize + 1;
  }
  return (Bit32u)!bVar1;
}

Assistant:

Bit32u MidiStreamParserImpl::parseShortMessageStatus(const Bit8u stream[]) {
	Bit8u status = *stream;
	Bit32u parsedLength = processStatusByte(status) ? 0 : 1;
	if (0x80 <= status) { // If no running status available yet, skip one byte
		*streamBuffer = status;
		++streamBufferSize;
	}
	return parsedLength;
}